

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O2

void __thiscall
estl::vector_s<std::__cxx11::string,10ul>::shift_right<std::__cxx11::string*>
          (vector_s<std::__cxx11::string,10ul> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *first,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *last,size_type n)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  bool bVar4;
  
  if (-1 < (long)last - (long)first) {
    paVar1 = &last->field_2;
    sVar2 = n;
    while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar1 + -1))->
      _M_dataplus)._M_p = (pointer)paVar1;
      *(size_type *)((long)paVar1 + -8) = 0;
      paVar1->_M_local_buf[0] = '\0';
      paVar1 = paVar1 + 2;
    }
    for (pbVar3 = last + -1; pbVar3 + 1 != first; pbVar3 = pbVar3 + -1) {
      std::__cxx11::string::operator=((string *)(pbVar3 + n),(string *)pbVar3);
    }
  }
  return;
}

Assistant:

void shift_right(InputIt first, InputIt last, size_type n)
    {
        const long diff_signed = last - first;
        if (diff_signed < 0) {
            return;
        }

        // Make room for elements
        for (size_type i = 0; i < n; ++i) {
            const pointer insert_ptr = last + i;
            new (insert_ptr) value_type(); // Default contruct the extra elements needed. Could perhaps construct when first needed instead!
        }

        for (InputIt it = last; it != first;) {
            --it;
            *(it+n) = std::move(*it);
        }
    }